

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fft.c
# Opt level: O3

int WebRtcSpl_RealForwardFFT(RealFFT *self,int16_t *real_data_in,int16_t *complex_data_out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int16_t complex_buffer [2048];
  int16_t local_1028 [2048];
  
  iVar1 = self->order;
  uVar4 = 1 << ((byte)iVar1 & 0x1f);
  if (iVar1 != 0x1f) {
    uVar2 = 1;
    if (1 < (int)uVar4) {
      uVar2 = (ulong)uVar4;
    }
    uVar3 = 0;
    do {
      local_1028[uVar3 * 2] = real_data_in[uVar3];
      local_1028[uVar3 * 2 + 1] = 0;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  WebRtcSpl_ComplexBitReverse(local_1028,iVar1);
  iVar1 = WebRtcSpl_ComplexFFT(local_1028,self->order,1);
  memcpy(complex_data_out,local_1028,(long)(int)uVar4 * 2 + 4);
  return iVar1;
}

Assistant:

int WebRtcSpl_RealForwardFFT(struct RealFFT* self,
                             const int16_t* real_data_in,
                             int16_t* complex_data_out) {
  int i = 0;
  int j = 0;
  int result = 0;
  int n = 1 << self->order;
  // The complex-value FFT implementation needs a buffer to hold 2^order
  // 16-bit COMPLEX numbers, for both time and frequency data.
  int16_t complex_buffer[2 << kMaxFFTOrder];

  // Insert zeros to the imaginary parts for complex forward FFT input.
  for (i = 0, j = 0; i < n; i += 1, j += 2) {
    complex_buffer[j] = real_data_in[i];
    complex_buffer[j + 1] = 0;
  };

  WebRtcSpl_ComplexBitReverse(complex_buffer, self->order);
  result = WebRtcSpl_ComplexFFT(complex_buffer, self->order, 1);

  // For real FFT output, use only the first N + 2 elements from
  // complex forward FFT.
  memcpy(complex_data_out, complex_buffer, sizeof(int16_t) * (n + 2));

  return result;
}